

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vardata.c
# Opt level: O0

void vardata_del(vardata *data)

{
  int local_14;
  int i;
  vardata *data_local;
  
  free(data->name);
  for (local_14 = 0; local_14 < data->featuresnum; local_14 = local_14 + 1) {
    free(data->features[local_14].name);
    free(data->features[local_14].description);
    free(data->features[local_14].ifmask);
    free(data->features[local_14].cfmask);
    free(data->features[local_14].implies);
    free(data->features[local_14].conflicts);
  }
  free(data->features);
  for (local_14 = 0; local_14 < data->variantsnum; local_14 = local_14 + 1) {
    free(data->variants[local_14].name);
    free(data->variants[local_14].description);
    free(data->variants[local_14].fmask);
    free(data->variants[local_14].features);
  }
  free(data->variants);
  for (local_14 = 0; local_14 < data->varsetsnum; local_14 = local_14 + 1) {
    free(data->varsets[local_14].name);
    free(data->varsets[local_14].description);
  }
  free(data->varsets);
  for (local_14 = 0; local_14 < data->modesnum; local_14 = local_14 + 1) {
    free(data->modes[local_14].name);
    free(data->modes[local_14].description);
    free(data->modes[local_14].rfmask);
    free(data->modes[local_14].rfeatures);
  }
  free(data->modes);
  for (local_14 = 0; local_14 < data->modesetsnum; local_14 = local_14 + 1) {
    free(data->modesets[local_14].name);
    free(data->modesets[local_14].description);
  }
  free(data->modesets);
  symtab_del(data->symtab);
  free(data);
  return;
}

Assistant:

void vardata_del(struct vardata *data) {
	int i;
	free(data->name);
	for (i = 0; i < data->featuresnum; i++) {
		free(data->features[i].name);
		free(data->features[i].description);
		free(data->features[i].ifmask);
		free(data->features[i].cfmask);
		free(data->features[i].implies);
		free(data->features[i].conflicts);
	}
	free(data->features);
	for (i = 0; i < data->variantsnum; i++) {
		free(data->variants[i].name);
		free(data->variants[i].description);
		free(data->variants[i].fmask);
		free(data->variants[i].features);
	}
	free(data->variants);
	for (i = 0; i < data->varsetsnum; i++) {
		free(data->varsets[i].name);
		free(data->varsets[i].description);
	}
	free(data->varsets);
	for (i = 0; i < data->modesnum; i++) {
		free(data->modes[i].name);
		free(data->modes[i].description);
		free(data->modes[i].rfmask);
		free(data->modes[i].rfeatures);
	}
	free(data->modes);
	for (i = 0; i < data->modesetsnum; i++) {
		free(data->modesets[i].name);
		free(data->modesets[i].description);
	}
	free(data->modesets);
	symtab_del(data->symtab);
	free(data);
}